

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void SortByDimension(Rtree *pRtree,int *aIdx,int nIdx,int iDim,RtreeCell *aCell,int *aSpare)

{
  undefined8 uVar1;
  undefined8 uVar2;
  u8 uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  int nIdx_00;
  int iVar10;
  uint nIdx_01;
  
  if (1 < nIdx) {
    nIdx_01 = (uint)nIdx >> 1;
    nIdx_00 = nIdx - nIdx_01;
    SortByDimension(pRtree,aIdx,nIdx_01,iDim,aCell,aSpare);
    SortByDimension(pRtree,aIdx + nIdx_01,nIdx_00,iDim,aCell,aSpare);
    memcpy(aSpare,aIdx,(ulong)nIdx_01 * 4);
    uVar3 = pRtree->eCoordType;
    uVar9 = 0;
    iVar10 = 0;
    do {
      iVar4 = (aIdx + nIdx_01)[iVar10];
      if (uVar3 == '\0') {
        uVar1 = *(undefined8 *)(aCell[aSpare[(int)uVar9]].aCoord + iDim * 2);
        uVar2 = *(undefined8 *)(aCell[iVar4].aCoord + iDim * 2);
        fVar5 = (float)uVar2;
        fVar7 = (float)((ulong)uVar2 >> 0x20);
        fVar6 = (float)uVar1;
        fVar8 = (float)((ulong)uVar1 >> 0x20);
      }
      else {
        uVar1 = *(undefined8 *)(aCell[aSpare[(int)uVar9]].aCoord + iDim * 2);
        fVar6 = (float)(int)uVar1;
        fVar8 = (float)(int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)(aCell[iVar4].aCoord + iDim * 2);
        fVar5 = (float)(int)uVar1;
        fVar7 = (float)(int)((ulong)uVar1 >> 0x20);
      }
      if ((uVar9 == nIdx_01) ||
         (((iVar10 != nIdx_00 && (fVar5 <= fVar6)) &&
          ((fVar6 != fVar5 || ((NAN(fVar6) || NAN(fVar5) || (fVar7 <= fVar8)))))))) {
        aIdx[(int)(uVar9 + iVar10)] = iVar4;
        iVar10 = iVar10 + 1;
      }
      else {
        aIdx[(int)(uVar9 + iVar10)] = aSpare[(int)uVar9];
        uVar9 = uVar9 + 1;
      }
    } while (iVar10 < nIdx_00 || (int)uVar9 < (int)nIdx_01);
  }
  return;
}

Assistant:

static void SortByDimension(
  Rtree *pRtree,
  int *aIdx, 
  int nIdx, 
  int iDim, 
  RtreeCell *aCell, 
  int *aSpare
){
  if( nIdx>1 ){

    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDimension(pRtree, aLeft, nLeft, iDim, aCell, aSpare);
    SortByDimension(pRtree, aRight, nRight, iDim, aCell, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;
    while( iLeft<nLeft || iRight<nRight ){
      RtreeDValue xleft1 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2]);
      RtreeDValue xleft2 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2+1]);
      RtreeDValue xright1 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2]);
      RtreeDValue xright2 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2+1]);
      if( (iLeft!=nLeft) && ((iRight==nRight)
       || (xleft1<xright1)
       || (xleft1==xright1 && xleft2<xright2)
      )){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue xleft1 = aCell[aIdx[jj-1]].aCoord[iDim*2];
        RtreeDValue xleft2 = aCell[aIdx[jj-1]].aCoord[iDim*2+1];
        RtreeDValue xright1 = aCell[aIdx[jj]].aCoord[iDim*2];
        RtreeDValue xright2 = aCell[aIdx[jj]].aCoord[iDim*2+1];
        assert( xleft1<=xright1 && (xleft1<xright1 || xleft2<=xright2) );
      }
    }
#endif
  }
}